

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestFreeList(void)

{
  uint __line;
  bool bVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  char *__function;
  _List_node_base *unaff_RBX;
  int iVar4;
  ulong unaff_RBP;
  char *__file;
  char *__assertion;
  _List_node_base *p_Var5;
  long lVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  bool bVar9;
  list<People_*,_std::allocator<People_*>_> check_list;
  
  puts("===================== TestFreeList BEGIN =====================");
  check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&check_list;
  check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node._M_size = 0;
  lVar6 = 10;
  bVar1 = false;
  p_Var7 = (_List_node_base *)0x0;
  check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  while (bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
    if (bVar1) {
      p_Var3 = unaff_RBX;
      if (unaff_RBP < 8) goto LAB_00106841;
      unaff_RBP = unaff_RBP - 8;
LAB_00106859:
      p_Var3 = (_List_node_base *)&unaff_RBX->_M_prev;
      p_Var5 = unaff_RBX;
    }
    else {
      bVar1 = true;
      p_Var3 = (_List_node_base *)0x0;
      unaff_RBP = 0;
LAB_00106841:
      unaff_RBX = (_List_node_base *)tcmalloc::SystemAlloc(0x8000000);
      if (unaff_RBX != (_List_node_base *)0xffffffffffffffff) {
        unaff_RBP = 0x7fffff8;
        goto LAB_00106859;
      }
      p_Var5 = (_List_node_base *)0x0;
    }
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = p_Var5;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node._M_size =
         check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node._M_size +
         1;
    p_Var5->_M_next = p_Var7;
    unaff_RBX = p_Var3;
    p_Var7 = p_Var5;
  }
  lVar6 = 10;
  p_Var3 = (_List_node_base *)0x0;
  iVar4 = 10;
  do {
    p_Var5 = check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (iVar4 == 0) {
      if (lVar6 == 0) {
        puts("===================== TestFreeList Finish =====================");
        std::__cxx11::_List_base<People_*,_std::allocator<People_*>_>::~_List_base
                  (&check_list.super__List_base<People_*,_std::allocator<People_*>_>);
        return;
      }
      __assertion = "freelist.Empty()";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
      ;
      __function = "void TestFreeList()";
      __line = 0x4a;
LAB_00106970:
      __assert_fail(__assertion,__file,__line,__function);
    }
    if (iVar4 != (int)lVar6) {
      __assertion = "freelist.FreeObjects() == i";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
      ;
      __function = "void TestFreeList()";
      __line = 0x45;
      goto LAB_00106970;
    }
    if (lVar6 == 0) {
      lVar6 = 0;
      p_Var8 = (_List_node_base *)0x0;
      p_Var2 = p_Var7;
    }
    else {
      lVar6 = lVar6 + -1;
      p_Var2 = p_Var7->_M_next;
      p_Var8 = p_Var7;
    }
    p_Var7 = check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node.
             super__List_node_base._M_next[1]._M_next;
    if (p_Var8 != p_Var7) {
      __assertion = "(People*)freelist.PopFront() == check_list.front()";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
      ;
      __function = "void TestFreeList()";
      __line = 0x46;
      goto LAB_00106970;
    }
    if (!bVar1) {
      __assertion = "inited";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
      ;
      __function = "void tcmalloc::FixedAllocator<People>::Free(T *) [T = People]";
      __line = 0x22;
      goto LAB_00106970;
    }
    p_Var7->_M_next = p_Var3;
    check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node._M_size =
         check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node._M_size -
         1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var5,0x18);
    p_Var3 = p_Var7;
    p_Var7 = p_Var2;
    iVar4 = iVar4 + -1;
  } while( true );
}

Assistant:

void TestFreeList() {
    printf("===================== TestFreeList BEGIN =====================\n");
    struct People {
        People(int age) : age_(age) {}
        int     age_;
        int     padding;
    };
    tcmalloc::FixedAllocator<People> allocator;

    std::list<People*> check_list;
    tcmalloc::FreeList freelist;
    assert(freelist.Empty());
    for (int i = 0; i < 10; ++i) {
        People* ptr = allocator.Alloc();
        check_list.push_front(ptr);
        freelist.PushFront(ptr);
        assert(freelist.FreeObjects() == (i+1));
    }
    for (int i = 10; i > 0; --i) {
        assert(freelist.FreeObjects() == i);
        assert((People*)freelist.PopFront() == check_list.front());
        allocator.Free(check_list.front());
        check_list.pop_front();
    }
    assert(freelist.Empty());
    printf("===================== TestFreeList Finish =====================\n");
}